

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

Identifier *
PDA::Transducer::Identifier::createIntegerLiteral(Identifier *__return_storage_ptr__,int value)

{
  Identifier(__return_storage_ptr__);
  __return_storage_ptr__->type = Integer;
  (__return_storage_ptr__->value).field_0 =
       (anon_union_8_2_6c0d51a1_for_IdentifierValue_0)(long)value;
  return __return_storage_ptr__;
}

Assistant:

Identifier Identifier::createIntegerLiteral(const int value)
{
    Identifier id;
    id.type = Identifier::Type::Integer;
    id.value.intValue = value;
    return id;
}